

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

void __thiscall GEO::geofile::make_coherent(geofile *this,bool *detailed)

{
  int iVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  pointer ppVar5;
  pointer __b;
  pointer ppVar6;
  pointer ppVar7;
  pointer ppVar8;
  pointer ppVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_bool> pVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_408;
  const_iterator local_400;
  int *local_3f8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_3f0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_3e8;
  const_iterator local_3e0;
  int *local_3d8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_3d0;
  _Self local_3c8;
  iterator i_2;
  iterator pv_m_end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_3a8;
  const_iterator local_3a0;
  int *local_398;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_390;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_388;
  const_iterator local_380;
  int *local_378;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_370;
  _Self local_368;
  iterator i_1;
  iterator ps_m_end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_348;
  const_iterator local_340;
  int *local_338;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_330;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_328;
  const_iterator local_320;
  int *local_318;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_310;
  _Self local_308;
  iterator i;
  iterator pc_m_end;
  int local_28c;
  pair<const_int,_int> local_288;
  _Base_ptr local_280;
  _Base_ptr local_278;
  _Base_ptr local_270;
  _Base_ptr local_268;
  _Base_ptr local_260;
  undefined1 local_258;
  pair<const_int,_int> local_250;
  _Base_ptr local_248;
  int local_23c;
  _Self _Stack_238;
  int curve_type_1;
  iterator inner_sur_loop_it;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> local_228;
  iterator sur_p_holder;
  iterator inner_sur_loop_end;
  iterator main_sur_loop_it;
  _Self local_208;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
  main_sur_loop_end;
  pair<const_int,_int> local_198;
  _Base_ptr local_190;
  _Self local_188;
  iterator inner_ps_loop_it;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_178;
  iterator ps_p_holder;
  iterator inner_ps_loop_end;
  iterator main_ps_loop_it;
  _Self local_158;
  _Rb_tree_iterator<std::pair<const_int,_int>_> main_ps_loop_end;
  int local_e4;
  pair<const_int,_int> local_e0;
  _Base_ptr local_d8;
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  pair<const_int,_int> local_a8;
  _Base_ptr local_a0;
  int local_94;
  _Self _Stack_90;
  int curve_type;
  iterator inner_cl_loop_it;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> local_80;
  iterator cl_p_holder;
  iterator inner_cl_loop_end;
  iterator main_cl_loop_it;
  _Self local_50;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> main_cl_loop_end
  ;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> changes;
  bool *detailed_local;
  geofile *this_local;
  
  coherent_points(this);
  coherent_lines(this);
  if ((*detailed & 1U) == 1) {
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &main_cl_loop_end);
    bVar2 = std::
            map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::empty(&this->curve_loops_map);
    if (!bVar2) {
      iVar3 = std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::end(&this->curve_loops_map);
      local_50._M_node =
           (_Base_ptr)
           std::
           prev<std::_Rb_tree_iterator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                     (iVar3._M_node,1);
      inner_cl_loop_end =
           std::
           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::begin(&this->curve_loops_map);
      while (bVar2 = std::operator!=(&inner_cl_loop_end,&local_50), bVar2) {
        cl_p_holder = std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::end(&this->curve_loops_map);
        local_80._M_node = inner_cl_loop_end._M_node;
        inner_cl_loop_it._M_node =
             (_Base_ptr)
             std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
             ::operator++(&local_80,0);
        _Stack_90._M_node = local_80._M_node;
        while (bVar2 = std::operator!=(&stack0xffffffffffffff70,&cl_p_holder), bVar2) {
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                   ::operator->(&inner_cl_loop_end);
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                   ::operator->(&stack0xffffffffffffff70);
          local_94 = compare_vector(&ppVar6->second,&ppVar7->second);
          if (local_94 == 1) {
            local_80._M_node = _Stack_90._M_node;
            local_a0 = (_Base_ptr)
                       std::
                       _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                       ::operator--(&local_80,0);
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                     ::operator->(&stack0xffffffffffffff70);
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                     ::operator->(&inner_cl_loop_end);
            std::pair<const_int,_int>::pair<const_int,_int,_true>
                      (&local_a8,&ppVar6->first,&ppVar7->first);
            pVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::insert((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&main_cl_loop_end,&local_a8);
            local_b8 = (_Base_ptr)pVar10.first._M_node;
            local_b0 = pVar10.second;
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                     ::operator->(&stack0xffffffffffffff70);
            std::
            map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::erase(&this->curve_loops_map,&ppVar6->first);
            _Stack_90._M_node = local_80._M_node;
            local_c0 = (_Base_ptr)
                       std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::end(&this->curve_loops_map);
            cl_p_holder._M_node = local_c0;
            local_d0 = (_Base_ptr)
                       std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::end(&this->curve_loops_map);
            local_c8 = (_Base_ptr)
                       std::
                       prev<std::_Rb_tree_iterator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                                 ((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                   )local_d0,1);
            local_50._M_node = local_c8;
          }
          else if (local_94 == 2) {
            local_80._M_node = _Stack_90._M_node;
            local_d8 = (_Base_ptr)
                       std::
                       _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                       ::operator--(&local_80,0);
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                     ::operator->(&stack0xffffffffffffff70);
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                     ::operator->(&inner_cl_loop_end);
            local_e4 = -ppVar7->first;
            std::pair<const_int,_int>::pair<int,_true>(&local_e0,&ppVar6->first,&local_e4);
            std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::insert
                      ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&main_cl_loop_end,&local_e0);
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                     ::operator->(&stack0xffffffffffffff70);
            std::
            map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::erase(&this->curve_loops_map,&ppVar6->first);
            _Stack_90._M_node = local_80._M_node;
            cl_p_holder = std::
                          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                          ::end(&this->curve_loops_map);
            iVar3 = std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::end(&this->curve_loops_map);
            local_50._M_node =
                 (_Base_ptr)
                 std::
                 prev<std::_Rb_tree_iterator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                           (iVar3._M_node,1);
          }
          std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
          operator++(&stack0xffffffffffffff70,0);
        }
        std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
        operator++(&inner_cl_loop_end,0);
      }
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &main_ps_loop_end,
                 (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &main_cl_loop_end);
      adjust_curve_loops(this,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&main_ps_loop_end);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &main_ps_loop_end);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::clear
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &main_cl_loop_end);
    }
    bVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::empty
                      (&this->plane_surfaces_map);
    if (!bVar2) {
      iVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                        (&this->plane_surfaces_map);
      local_158._M_node =
           (_Base_ptr)std::prev<std::_Rb_tree_iterator<std::pair<int_const,int>>>(iVar4._M_node,1);
      inner_ps_loop_end =
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                     (&this->plane_surfaces_map);
      while (bVar2 = std::operator!=(&inner_ps_loop_end,&local_158), bVar2) {
        ps_p_holder = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      end(&this->plane_surfaces_map);
        local_178._M_node = inner_ps_loop_end._M_node;
        inner_ps_loop_it._M_node =
             (_Base_ptr)std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&local_178,0)
        ;
        local_188._M_node = local_178._M_node;
        while (bVar2 = std::operator!=(&local_188,&ps_p_holder), bVar2) {
          ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                             (&inner_ps_loop_end);
          iVar1 = ppVar5->second;
          ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_188);
          if (iVar1 == ppVar5->second) {
            local_178._M_node = local_188._M_node;
            local_190 = (_Base_ptr)
                        std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator--(&local_178,0)
            ;
            ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_188);
            __b = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&inner_ps_loop_end)
            ;
            std::pair<const_int,_int>::pair<const_int,_int,_true>
                      (&local_198,&ppVar5->first,&__b->first);
            std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::insert
                      ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&main_cl_loop_end,&local_198);
            ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_188);
            std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::erase
                      (&this->plane_surfaces_map,&ppVar5->first);
            local_188._M_node = local_178._M_node;
            ps_p_holder = std::
                          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          ::end(&this->plane_surfaces_map);
            iVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::end(&this->plane_surfaces_map);
            local_158._M_node =
                 (_Base_ptr)
                 std::prev<std::_Rb_tree_iterator<std::pair<int_const,int>>>(iVar4._M_node,1);
          }
          std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&local_188,0);
        }
        std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&inner_ps_loop_end,0);
      }
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &main_sur_loop_end,
                 (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &main_cl_loop_end);
      adjust_plane_surfaces
                (this,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &main_sur_loop_end);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &main_sur_loop_end);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::clear
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &main_cl_loop_end);
    }
    bVar2 = std::
            map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::empty(&this->surface_loops_map);
    if (!bVar2) {
      iVar3 = std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::end(&this->surface_loops_map);
      local_208._M_node =
           (_Base_ptr)
           std::
           prev<std::_Rb_tree_iterator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                     (iVar3._M_node,1);
      inner_sur_loop_end =
           std::
           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::begin(&this->surface_loops_map);
      while (bVar2 = std::operator!=(&inner_sur_loop_end,&local_208), bVar2) {
        sur_p_holder = std::
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::end(&this->surface_loops_map);
        local_228._M_node = inner_sur_loop_end._M_node;
        inner_sur_loop_it._M_node =
             (_Base_ptr)
             std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
             ::operator++(&local_228,0);
        _Stack_238._M_node = local_228._M_node;
        while (bVar2 = std::operator!=(&stack0xfffffffffffffdc8,&sur_p_holder), bVar2) {
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                   ::operator->(&inner_sur_loop_end);
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                   ::operator->(&stack0xfffffffffffffdc8);
          local_23c = compare_vector(&ppVar6->second,&ppVar7->second);
          if (local_23c == 1) {
            local_228._M_node = _Stack_238._M_node;
            local_248 = (_Base_ptr)
                        std::
                        _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                        ::operator--(&local_228,0);
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                     ::operator->(&stack0xfffffffffffffdc8);
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                     ::operator->(&inner_sur_loop_end);
            std::pair<const_int,_int>::pair<const_int,_int,_true>
                      (&local_250,&ppVar6->first,&ppVar7->first);
            pVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::insert((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&main_cl_loop_end,&local_250);
            local_260 = (_Base_ptr)pVar10.first._M_node;
            local_258 = pVar10.second;
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                     ::operator->(&stack0xfffffffffffffdc8);
            std::
            map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::erase(&this->curve_loops_map,&ppVar6->first);
            _Stack_238._M_node = local_228._M_node;
            local_268 = (_Base_ptr)
                        std::
                        map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                        ::end(&this->surface_loops_map);
            sur_p_holder._M_node = local_268;
            local_278 = (_Base_ptr)
                        std::
                        map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                        ::end(&this->surface_loops_map);
            local_270 = (_Base_ptr)
                        std::
                        prev<std::_Rb_tree_iterator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                                  ((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                    )local_278,1);
            local_208._M_node = local_270;
          }
          else if (local_23c == 2) {
            local_228._M_node = _Stack_238._M_node;
            local_280 = (_Base_ptr)
                        std::
                        _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                        ::operator--(&local_228,0);
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                     ::operator->(&stack0xfffffffffffffdc8);
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                     ::operator->(&inner_sur_loop_end);
            local_28c = -ppVar7->first;
            std::pair<const_int,_int>::pair<int,_true>(&local_288,&ppVar6->first,&local_28c);
            std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::insert
                      ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&main_cl_loop_end,&local_288);
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                     ::operator->(&stack0xfffffffffffffdc8);
            std::
            map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::erase(&this->curve_loops_map,&ppVar6->first);
            _Stack_238._M_node = local_228._M_node;
            sur_p_holder = std::
                           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                           ::end(&this->surface_loops_map);
            iVar3 = std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::end(&this->surface_loops_map);
            local_208._M_node =
                 (_Base_ptr)
                 std::
                 prev<std::_Rb_tree_iterator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                           (iVar3._M_node,1);
          }
          std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
          operator++(&stack0xfffffffffffffdc8,0);
        }
        std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
        operator++(&inner_sur_loop_end,0);
      }
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &pc_m_end,
                 (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &main_cl_loop_end);
      adjust_surface_loops
                (this,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &pc_m_end);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &pc_m_end);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::clear
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &main_cl_loop_end);
    }
    i = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::end(&this->physical_curves_map);
    local_308._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
         ::begin(&this->physical_curves_map);
    while (bVar2 = std::operator!=(&local_308,&i), bVar2) {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_308);
      local_310._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&ppVar8->second);
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_308);
      local_318 = (int *)std::vector<int,_std::allocator<int>_>::end(&ppVar8->second);
      std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_310,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_318);
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_308);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_308);
      local_330._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&ppVar9->second);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_308);
      local_338 = (int *)std::vector<int,_std::allocator<int>_>::end(&ppVar9->second);
      local_328 = std::
                  unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            (local_330,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             local_338);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_320,
                 &local_328);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_308);
      local_348._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(&ppVar9->second);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_340,
                 &local_348);
      std::vector<int,_std::allocator<int>_>::erase(&ppVar8->second,local_320,local_340);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
      ::operator++(&local_308,0);
    }
    i_1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::end(&this->physical_surfaces_map);
    local_368._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
         ::begin(&this->physical_surfaces_map);
    while (bVar2 = std::operator!=(&local_368,&i_1), bVar2) {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_368);
      local_370._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&ppVar8->second);
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_368);
      local_378 = (int *)std::vector<int,_std::allocator<int>_>::end(&ppVar8->second);
      std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_370,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_378);
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_368);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_368);
      local_390._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&ppVar9->second);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_368);
      local_398 = (int *)std::vector<int,_std::allocator<int>_>::end(&ppVar9->second);
      local_388 = std::
                  unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            (local_390,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             local_398);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_380,
                 &local_388);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_368);
      local_3a8._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(&ppVar9->second);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_3a0,
                 &local_3a8);
      std::vector<int,_std::allocator<int>_>::erase(&ppVar8->second,local_380,local_3a0);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
      ::operator++(&local_368,0);
    }
    i_2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::end(&this->physical_volumes_map);
    local_3c8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
         ::begin(&this->physical_volumes_map);
    while (bVar2 = std::operator!=(&local_3c8,&i_2), bVar2) {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_3c8);
      local_3d0._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&ppVar8->second);
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_3c8);
      local_3d8 = (int *)std::vector<int,_std::allocator<int>_>::end(&ppVar8->second);
      std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (local_3d0,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_3d8);
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_3c8);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_3c8);
      local_3f0._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&ppVar9->second);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_3c8);
      local_3f8 = (int *)std::vector<int,_std::allocator<int>_>::end(&ppVar9->second);
      local_3e8 = std::
                  unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            (local_3f0,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             local_3f8);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_3e0,
                 &local_3e8);
      ppVar9 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_3c8);
      local_408._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(&ppVar9->second);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_400,
                 &local_408);
      std::vector<int,_std::allocator<int>_>::erase(&ppVar8->second,local_3e0,local_400);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
      ::operator++(&local_3c8,0);
    }
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &main_cl_loop_end);
  }
  return;
}

Assistant:

void GEO::geofile::make_coherent(const bool &detailed)
{
    // start_timer();                                                                      //DEBUG
    coherent_points();
    // std::cout << std::endl;                                                             //DEBUG
    // std::cout << "Time: coherent_points = " << get_microseconds()/1e3 << std::endl;     //DEBUG
    // start_timer();                                                                      //DEBUG
    coherent_lines();
    // std::cout << "Time: coherent_lines = " << get_microseconds()/1e3 << std::endl;      //DEBUG
    // start_timer();                                                                      //DEBUG
    if ( detailed==true)
    {
        std::map<int,int> changes;
        // ------- Search for duplicated curve loops --------
        if (!curve_loops_map.empty())
        {
            auto main_cl_loop_end = std::prev(curve_loops_map.end());
            for (auto main_cl_loop_it = curve_loops_map.begin();
                main_cl_loop_it != main_cl_loop_end;
                main_cl_loop_it++)
            {
                auto inner_cl_loop_end = curve_loops_map.end();
                auto cl_p_holder = main_cl_loop_it; cl_p_holder++;
                for (auto inner_cl_loop_it = cl_p_holder;
                    inner_cl_loop_it != inner_cl_loop_end;
                    inner_cl_loop_it++)
                {
                    int curve_type = compare_vector(main_cl_loop_it->second, inner_cl_loop_it->second);
                    switch (curve_type)
                    {
                    case 1/*identical*/:
                        cl_p_holder = inner_cl_loop_it; cl_p_holder--;
                        changes.insert({inner_cl_loop_it->first,main_cl_loop_it->first});
                        curve_loops_map.erase(inner_cl_loop_it->first);
                        inner_cl_loop_it = cl_p_holder;
                        inner_cl_loop_end = curve_loops_map.end();
                        main_cl_loop_end = std::prev(curve_loops_map.end());
                        break;
                    case 2/*reversed*/:
                        cl_p_holder = inner_cl_loop_it; cl_p_holder--;
                        changes.insert({inner_cl_loop_it->first,-main_cl_loop_it->first});
                        curve_loops_map.erase(inner_cl_loop_it->first);
                        inner_cl_loop_it = cl_p_holder;
                        inner_cl_loop_end = curve_loops_map.end();
                        main_cl_loop_end = std::prev(curve_loops_map.end());
                        break;
                    default:
                        break;
                    }
                }
            }
            adjust_curve_loops(changes);
            changes.clear();
        }
        // ------ Search for duplicated plane surfaces ------
        if (!plane_surfaces_map.empty())
        {
            auto main_ps_loop_end = std::prev(plane_surfaces_map.end());
            for (auto main_ps_loop_it = plane_surfaces_map.begin();
                main_ps_loop_it != main_ps_loop_end;
                main_ps_loop_it++)
            {
                auto inner_ps_loop_end = plane_surfaces_map.end();
                auto ps_p_holder = main_ps_loop_it; ps_p_holder++;
                for (auto inner_ps_loop_it = ps_p_holder;
                    inner_ps_loop_it != inner_ps_loop_end;
                    inner_ps_loop_it++)
                {
                    if (main_ps_loop_it->second == inner_ps_loop_it->second)
                    {
                        ps_p_holder = inner_ps_loop_it; ps_p_holder--;
                        changes.insert({ inner_ps_loop_it->first, main_ps_loop_it->first });
                        plane_surfaces_map.erase(inner_ps_loop_it->first);
                        inner_ps_loop_it = ps_p_holder;
                        inner_ps_loop_end = plane_surfaces_map.end();
                        main_ps_loop_end = std::prev(plane_surfaces_map.end());
                    }
                }
            }
            adjust_plane_surfaces(changes);
            changes.clear();
        }
        // ------ Search for duplicated surface loops -------
        if (!surface_loops_map.empty())
        {
            auto main_sur_loop_end = std::prev(surface_loops_map.end());
            for (auto main_sur_loop_it = surface_loops_map.begin();
                main_sur_loop_it != main_sur_loop_end;
                main_sur_loop_it++)
            {
                auto inner_sur_loop_end = surface_loops_map.end();
                auto sur_p_holder = main_sur_loop_it; sur_p_holder++;
                for (auto inner_sur_loop_it = sur_p_holder;
                    inner_sur_loop_it != inner_sur_loop_end;
                    inner_sur_loop_it++)
                {
                    int curve_type = compare_vector(main_sur_loop_it->second, inner_sur_loop_it->second);
                    switch (curve_type)
                    {
                    case 1/*identical*/:
                        sur_p_holder = inner_sur_loop_it; sur_p_holder--;
                        changes.insert({inner_sur_loop_it->first,main_sur_loop_it->first});
                        curve_loops_map.erase(inner_sur_loop_it->first);
                        inner_sur_loop_it = sur_p_holder;
                        inner_sur_loop_end = surface_loops_map.end();
                        main_sur_loop_end = std::prev(surface_loops_map.end());
                        break;
                    case 2/*reversed*/:
                        sur_p_holder = inner_sur_loop_it; sur_p_holder--;
                        changes.insert({inner_sur_loop_it->first,-main_sur_loop_it->first});
                        curve_loops_map.erase(inner_sur_loop_it->first);
                        inner_sur_loop_it = sur_p_holder;
                        inner_sur_loop_end = surface_loops_map.end();
                        main_sur_loop_end = std::prev(surface_loops_map.end());
                        break;
                    default:
                        break;
                    }
                }
            }
            adjust_surface_loops(changes);
            changes.clear();
        }
        // --- Search for duplicated physical elemements ----
        // Physical Curves
        auto pc_m_end = physical_curves_map.end();
        for ( auto i = physical_curves_map.begin();
            i != pc_m_end;
            i++)
        {
            std::sort(i->second.begin(),i->second.end());
            i->second.erase( unique(i->second.begin(),i->second.end() ), i->second.end());
        }
        // Physical Surfaces
        auto ps_m_end = physical_surfaces_map.end();
        for ( auto i = physical_surfaces_map.begin();
            i != ps_m_end;
            i++)
        {
            std::sort(i->second.begin(),i->second.end());
            i->second.erase( unique(i->second.begin(),i->second.end() ), i->second.end());
        }
        // Physical Volumes
        auto pv_m_end = physical_volumes_map.end();
        for ( auto i = physical_volumes_map.begin();
            i != pv_m_end;
            i++)
        {
            std::sort(i->second.begin(),i->second.end());
            i->second.erase( unique(i->second.begin(),i->second.end() ), i->second.end());
        }
    }
}